

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O1

ztresult_t
zt_save(ztstruct_t *metastruct,void *structure,char *filename,ztregion_t *regions,int nregions,
       ztsaver_t **savers,int nsavers)

{
  ztresult_t zVar1;
  FILE *local_68;
  undefined8 uStack_60;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  ztsaver_t **local_40;
  int local_38;
  
  local_68 = fopen(filename,"wb");
  if (local_68 == (FILE *)0x0) {
    zVar1 = 0x50;
  }
  else {
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_60 = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_38 = nsavers;
    local_40 = savers;
    zVar1 = zt_walk(metastruct,structure,regions,nregions,&zt_save::savehandlers,&local_68);
    free((void *)CONCAT44(uStack_4c,uStack_50));
    fclose(local_68);
  }
  return zVar1;
}

Assistant:

ztresult_t zt_save(const ztstruct_t  *metastruct,
                   const void        *structure,
                   const char        *filename,
                   const ztregion_t  *regions,
                   int                nregions,
                   ztsaver_t        **savers,
                   int                nsavers)
{
  static const ztwalkhandlers_t savehandlers =
  {
    savehandler_uchar,
    savehandler_ushort,
    savehandler_uint,
    savehandler_index,
    savehandler_version,
    savehandler_startstruct,
    savehandler_endstruct,
    savehandler_startarray,
    savehandler_endarray,
    savehandler_custom
  };

  ztresult_t  rc;
  savestate_t state;

  assert(metastruct);
  assert(structure);
  assert(filename);
  /* regions may be NULL */
  assert(nregions >= 0);
  /* savers may be NULL */
  assert(nsavers >= 0);

  state.f = fopen(filename, "wb");
  if (state.f == NULL)
    return ztresult_BAD_FOPEN;
  
  state.indent_is_due = 0;
  state.depth         = 0;
  savestack_setup(&state.stack);
  state.savers        = savers;
  state.nsavers       = nsavers;

  rc = zt_walk(metastruct, structure, regions, nregions, &savehandlers, &state);
  if (rc)
    goto err;

  savestack_destroy(&state.stack);
  fclose(state.f);

  return ztresult_OK;


err:
  savestack_destroy(&state.stack);
  fclose(state.f);

  return rc;
}